

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacReadVer.c
# Opt level: O0

int Psr_ManReadAssign(Psr_Man_t *p)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  int local_2c;
  int Oper;
  int fCompl2;
  int fCompl;
  int InItem;
  int OutItem;
  Psr_Man_t *p_local;
  
  iVar1 = Psr_ManReadSignal(p);
  if (iVar1 == 0) {
    p_local._4_4_ = Psr_ManErrorSet(p,"Cannot read output in assign-statement.",0);
  }
  else {
    iVar2 = Psr_ManIsChar(p,'=');
    if (iVar2 == 0) {
      p_local._4_4_ = Psr_ManErrorSet(p,"Expecting \"=\" in assign-statement.",0);
    }
    else {
      p->pCur = p->pCur + 1;
      iVar2 = Psr_ManUtilSkipSpaces(p);
      if (iVar2 == 0) {
        iVar2 = Psr_ManIsChar(p,'~');
        bVar3 = iVar2 != 0;
        if (bVar3) {
          p->pCur = p->pCur + 1;
        }
        iVar2 = Psr_ManReadSignal(p);
        if (iVar2 == 0) {
          p_local._4_4_ =
               Psr_ManErrorSet(p,"Cannot read first input name in the assign-statement.",0);
        }
        else {
          Vec_IntClear(&p->vTemp);
          Vec_IntPush(&p->vTemp,0);
          Vec_IntPush(&p->vTemp,iVar2);
          iVar2 = Psr_ManIsChar(p,';');
          if (iVar2 == 0) {
            iVar2 = Psr_ManIsChar(p,'&');
            if (iVar2 == 0) {
              iVar2 = Psr_ManIsChar(p,'|');
              if (iVar2 == 0) {
                iVar2 = Psr_ManIsChar(p,'^');
                if (iVar2 == 0) {
                  iVar2 = Psr_ManIsChar(p,'?');
                  if (iVar2 == 0) {
                    iVar1 = Psr_ManErrorSet(p,"Unrecognized operator in the assign-statement.",0);
                    return iVar1;
                  }
                  local_2c = 0x14;
                }
                else {
                  local_2c = 0x10;
                }
              }
              else {
                local_2c = 0xe;
              }
            }
            else {
              local_2c = 0xc;
            }
            p->pCur = p->pCur + 1;
            iVar2 = Psr_ManUtilSkipSpaces(p);
            if (iVar2 == 0) {
              iVar2 = Psr_ManIsChar(p,'~');
              bVar4 = iVar2 != 0;
              if (bVar4) {
                p->pCur = p->pCur + 1;
              }
              iVar2 = Psr_ManReadSignal(p);
              if (iVar2 == 0) {
                p_local._4_4_ =
                     Psr_ManErrorSet(p,"Cannot read second input name in the assign-statement.",0);
              }
              else {
                Vec_IntPush(&p->vTemp,0);
                Vec_IntPush(&p->vTemp,iVar2);
                if (local_2c == 0x14) {
                  if (bVar3) {
                    __assert_fail("fCompl == 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/bac/bacReadVer.c"
                                  ,0x241,"int Psr_ManReadAssign(Psr_Man_t *)");
                  }
                  iVar2 = Psr_ManIsChar(p,':');
                  if (iVar2 == 0) {
                    iVar1 = Psr_ManErrorSet(p,"Expected colon in the MUX assignment.",0);
                    return iVar1;
                  }
                  p->pCur = p->pCur + 1;
                  iVar2 = Psr_ManReadSignal(p);
                  if (iVar2 == 0) {
                    iVar1 = Psr_ManErrorSet(p,
                                            "Cannot read third input name in the assign-statement.",
                                            0);
                    return iVar1;
                  }
                  Vec_IntPush(&p->vTemp,0);
                  Vec_IntPush(&p->vTemp,iVar2);
                  iVar2 = Psr_ManIsChar(p,';');
                  if (iVar2 == 0) {
                    iVar1 = Psr_ManErrorSet(p,
                                            "Expected semicolon at the end of the assign-statement."
                                            ,0);
                    return iVar1;
                  }
                }
                else if (local_2c == 0xc) {
                  if ((!bVar3) || (bVar4)) {
                    if ((bVar3) || (!bVar4)) {
                      if ((bVar3) && (bVar4)) {
                        local_2c = 0xf;
                      }
                    }
                    else {
                      local_2c = 0x12;
                    }
                  }
                  else {
                    local_2c = 0x13;
                  }
                }
                else if (local_2c == 0xe) {
                  if ((bVar3) && (bVar4)) {
                    local_2c = 0xd;
                  }
                  else if ((bVar3) || (bVar4)) {
                    __assert_fail("!fCompl && !fCompl2",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/bac/bacReadVer.c"
                                  ,0x25b,"int Psr_ManReadAssign(Psr_Man_t *)");
                  }
                }
                else if (local_2c == 0x10) {
                  if ((!bVar3) || (bVar4)) {
                    if ((bVar3) || (bVar4)) {
                      __assert_fail("!fCompl && !fCompl2",
                                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/bac/bacReadVer.c"
                                    ,0x261,"int Psr_ManReadAssign(Psr_Man_t *)");
                    }
                  }
                  else {
                    local_2c = 0x11;
                  }
                }
                Vec_IntPush(&p->vTemp,0);
                Vec_IntPush(&p->vTemp,iVar1);
                Psr_NtkAddBox(p->pNtk,local_2c,0,&p->vTemp);
                p_local._4_4_ = 1;
              }
            }
            else {
              p_local._4_4_ = Psr_ManErrorSet(p,"Error number 24.",0);
            }
          }
          else {
            Vec_IntPush(&p->vTemp,0);
            Vec_IntPush(&p->vTemp,iVar1);
            iVar1 = 10;
            if (bVar3) {
              iVar1 = 0xb;
            }
            Psr_NtkAddBox(p->pNtk,iVar1,0,&p->vTemp);
            p_local._4_4_ = 1;
          }
        }
      }
      else {
        p_local._4_4_ = Psr_ManErrorSet(p,"Error number 23.",0);
      }
    }
  }
  return p_local._4_4_;
}

Assistant:

static inline int Psr_ManReadAssign( Psr_Man_t * p )
{
    int OutItem, InItem, fCompl = 0, fCompl2 = 0, Oper = 0;
    // read output name
    OutItem = Psr_ManReadSignal( p );
    if ( OutItem == 0 )                     return Psr_ManErrorSet(p, "Cannot read output in assign-statement.", 0);
    if ( !Psr_ManIsChar(p, '=') )           return Psr_ManErrorSet(p, "Expecting \"=\" in assign-statement.", 0);
    p->pCur++;
    if ( Psr_ManUtilSkipSpaces(p) )         return Psr_ManErrorSet(p, "Error number 23.", 0);
    if ( Psr_ManIsChar(p, '~') ) 
    { 
        fCompl = 1; 
        p->pCur++; 
    }
    // read first name
    InItem = Psr_ManReadSignal( p );
    if ( InItem == 0 )                      return Psr_ManErrorSet(p, "Cannot read first input name in the assign-statement.", 0);
    Vec_IntClear( &p->vTemp );
    Vec_IntPush( &p->vTemp, 0 );
    Vec_IntPush( &p->vTemp, InItem );
    // check unary operator
    if ( Psr_ManIsChar(p, ';') )
    {
        Vec_IntPush( &p->vTemp, 0 );
        Vec_IntPush( &p->vTemp, OutItem );
        Oper = fCompl ? BAC_BOX_INV : BAC_BOX_BUF;
        Psr_NtkAddBox( p->pNtk, Oper, 0, &p->vTemp );
        return 1;
    }
    if ( Psr_ManIsChar(p, '&') ) 
        Oper = BAC_BOX_AND;
    else if ( Psr_ManIsChar(p, '|') ) 
        Oper = BAC_BOX_OR;
    else if ( Psr_ManIsChar(p, '^') ) 
        Oper = BAC_BOX_XOR;
    else if ( Psr_ManIsChar(p, '?') ) 
        Oper = BAC_BOX_MUX;
    else                                    return Psr_ManErrorSet(p, "Unrecognized operator in the assign-statement.", 0);
    p->pCur++; 
    if ( Psr_ManUtilSkipSpaces(p) )         return Psr_ManErrorSet(p, "Error number 24.", 0);
    if ( Psr_ManIsChar(p, '~') ) 
    { 
        fCompl2 = 1; 
        p->pCur++; 
    }
    // read second name
    InItem = Psr_ManReadSignal( p );
    if ( InItem == 0 )                      return Psr_ManErrorSet(p, "Cannot read second input name in the assign-statement.", 0);
    Vec_IntPush( &p->vTemp, 0 );
    Vec_IntPush( &p->vTemp, InItem );
    // read third argument
    if ( Oper == BAC_BOX_MUX )
    {
        assert( fCompl == 0 ); 
        if ( !Psr_ManIsChar(p, ':') )       return Psr_ManErrorSet(p, "Expected colon in the MUX assignment.", 0);
        p->pCur++; 
        // read third name
        InItem = Psr_ManReadSignal( p );
        if ( InItem == 0 )                  return Psr_ManErrorSet(p, "Cannot read third input name in the assign-statement.", 0);
        Vec_IntPush( &p->vTemp, 0 );
        Vec_IntPush( &p->vTemp, InItem );
        if ( !Psr_ManIsChar(p, ';') )       return Psr_ManErrorSet(p, "Expected semicolon at the end of the assign-statement.", 0);
    }
    else
    {
        // figure out operator
        if ( Oper == BAC_BOX_AND )
        {
            if ( fCompl && !fCompl2 )
                Oper = BAC_BOX_SHARPL;
            else if ( !fCompl && fCompl2 )
                Oper = BAC_BOX_SHARP;
            else if ( fCompl && fCompl2 )
                Oper = BAC_BOX_NOR;
        }
        else if ( Oper == BAC_BOX_OR )
        {
            if ( fCompl && fCompl2 )
                Oper = BAC_BOX_NAND;
            else assert( !fCompl && !fCompl2 );
        }
        else if ( Oper == BAC_BOX_XOR )
        {
            if ( fCompl && !fCompl2 )
                Oper = BAC_BOX_XNOR;
            else assert( !fCompl && !fCompl2 );
        }
    }
    // write binary operator
    Vec_IntPush( &p->vTemp, 0 );
    Vec_IntPush( &p->vTemp, OutItem );
    Psr_NtkAddBox( p->pNtk, Oper, 0, &p->vTemp );
    return 1;
}